

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmValue cVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  long lVar5;
  string *psVar6;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  string *local_218;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  string local_160;
  undefined1 local_13a;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  cmList defs;
  string local_a8;
  cmValue local_88;
  cmValue cdefs;
  char *define;
  string local_58;
  byte local_21;
  string *psStack_20;
  bool remove_local;
  string *def_local;
  cmMakefile *this_local;
  
  local_21 = remove;
  psStack_20 = def;
  def_local = (string *)this;
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar2 = cmsys::RegularExpression::find(&ParseDefineFlag::valid,psStack_20);
  if (!bVar2) {
    return false;
  }
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
     iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                 &__dso_handle);
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
  }
  bVar2 = cmsys::RegularExpression::find(&ParseDefineFlag::trivial,psStack_20);
  if (bVar2) goto switchD_00499afb_default;
  PVar4 = GetPolicyStatus(this,CMP0005,false);
  switch(PVar4) {
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_58,(cmPolicies *)0x5,id);
    IssueMessage(this,AUTHOR_WARNING,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  case OLD:
    this_local._7_1_ = false;
    break;
  case NEW:
  default:
switchD_00499afb_default:
    lVar5 = std::__cxx11::string::c_str();
    cdefs.Value = (string *)(lVar5 + 2);
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"COMPILE_DEFINITIONS",&local_1a9);
      cVar1 = cdefs;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,(char *)cVar1.Value,&local_1d1);
      AppendProperty(this,&local_1a8,&local_1d0,false);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"COMPILE_DEFINITIONS",
                 (allocator<char> *)
                 ((long)&defs.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_88 = GetProperty(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&defs.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar2 = cmValue::operator_cast_to_bool(&local_88);
      if (bVar2) {
        local_100 = (undefined1  [8])(local_100 + 8);
        psVar6 = cmValue::operator*[abi_cxx11_(&local_88);
        std::__cxx11::string::string((string *)(local_100 + 8),(string *)psVar6);
        local_d8 = (iterator)(local_100 + 8);
        local_d0 = 1;
        init._M_len = 1;
        init._M_array = local_d8;
        cmList::cmList((cmList *)local_c8,init);
        local_218 = (string *)&local_d8;
        do {
          local_218 = local_218 + -0x20;
          std::__cxx11::string::~string(local_218);
          cVar1 = cdefs;
        } while (local_218 != (string *)(local_100 + 8));
        local_13a = 1;
        local_138 = &local_130;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,(char *)cVar1.Value,&local_139);
        local_13a = 0;
        local_110 = &local_130;
        local_108 = 1;
        values._M_len = 1;
        values._M_array = local_110;
        cmList::remove_items((cmList *)local_c8,values);
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
        do {
          local_248 = local_248 + -1;
          std::__cxx11::string::~string((string *)local_248);
        } while (local_248 != &local_130);
        std::allocator<char>::~allocator(&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"COMPILE_DEFINITIONS",&local_161);
        cmList::to_string_abi_cxx11_(&local_188,(cmList *)local_c8);
        SetProperty(this,&local_160,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        cmList::~cmList((cmList *)local_c8);
      }
    }
    this_local._7_1_ = true;
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&define,(cmPolicies *)0x5,id);
    IssueMessage(this,FATAL_ERROR,(string *)&define);
    std::__cxx11::string::~string((string *)&define);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if (!valid.find(def)) {
    return false;
  }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression trivial(
    "^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if (!trivial.find(def)) {
    // This definition has a non-trivial value.
    switch (this->GetPolicyStatus(cmPolicies::CMP0005)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0005));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005));
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
    }
  }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if (remove) {
    if (cmValue cdefs = this->GetProperty("COMPILE_DEFINITIONS")) {
      // Expand the list.
      cmList defs{ *cdefs };

      // Recompose the list without the definition.
      defs.remove_items({ define });

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", defs.to_string());
    }
  } else {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
  }

  return true;
}